

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::AddIfExists(cmCTest *this,Part part,char *file)

{
  char *pcVar1;
  bool bVar2;
  allocator local_81;
  undefined1 local_80 [8];
  string name;
  allocator local_49;
  string local_48;
  char *local_28;
  char *file_local;
  cmCTest *pcStack_18;
  Part part_local;
  cmCTest *this_local;
  
  local_28 = file;
  file_local._4_4_ = part;
  pcStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,file,&local_49);
  bVar2 = CTestFileExists(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = local_28;
  if (bVar2) {
    AddSubmitFile(this,file_local._4_4_,local_28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_80,pcVar1,&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::operator+=((string *)local_80,".gz");
    bVar2 = CTestFileExists(this,(string *)local_80);
    if (bVar2) {
      AddSubmitFile(this,file_local._4_4_,local_28);
    }
    else {
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_80);
    if (!bVar2) goto LAB_0053611a;
  }
  this_local._7_1_ = 1;
LAB_0053611a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTest::AddIfExists(Part part, const char* file)
{
  if (this->CTestFileExists(file)) {
    this->AddSubmitFile(part, file);
  } else {
    std::string name = file;
    name += ".gz";
    if (this->CTestFileExists(name)) {
      this->AddSubmitFile(part, file);
    } else {
      return false;
    }
  }
  return true;
}